

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O0

ConstantExpression * __thiscall
COLLADASaxFWL::FormulasLoader::createConstant(FormulasLoader *this,String *value)

{
  ConstantExpression *pCVar1;
  double dVar2;
  bool boolValue;
  double doubleValue;
  bool failed;
  ConstantExpression *constant;
  bool *in_stack_ffffffffffffffb8;
  ConstantExpression *buffer;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  ConstantExpression *in_stack_ffffffffffffffd0;
  
  pCVar1 = (ConstantExpression *)operator_new(0x40);
  MathML::AST::ConstantExpression::ConstantExpression
            (in_stack_ffffffffffffffd0,
             (String *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  buffer = pCVar1;
  std::__cxx11::string::c_str();
  dVar2 = GeneratedSaxParser::Utils::toDouble((ParserChar *)buffer,in_stack_ffffffffffffffb8);
  (*(pCVar1->super_INode)._vptr_INode[6])(dVar2);
  return pCVar1;
}

Assistant:

MathML::AST::ConstantExpression* FormulasLoader::createConstant( const String& value )
	{
		MathML::AST::ConstantExpression* constant = FW_NEW MathML::AST::ConstantExpression( value );

		bool failed = false;
		double doubleValue = GeneratedSaxParser::Utils::toDouble( value.c_str(), failed );
		if ( !failed )
		{
			constant->setValue( doubleValue );
		}
		else
		{
			bool boolValue = GeneratedSaxParser::Utils::toBool( value.c_str(), failed );
			if ( !failed )
			{
				constant->setValue( boolValue );
			}
		}

		return constant;
	}